

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

void sysbvm_function_addFlags
               (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_bitflags_t flags)

{
  _Bool _Var1;
  ulong uVar2;
  
  _Var1 = sysbvm_tuple_isFunction((sysbvm_context_t *)function,function);
  if (!_Var1) {
    sysbvm_error("Expected a function.");
  }
  uVar2 = *(ulong *)(function + 0x28);
  if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
    uVar2 = (long)uVar2 >> 4;
  }
  else {
    uVar2 = *(ulong *)(uVar2 + 0x10);
  }
  *(ulong *)(function + 0x28) = (uVar2 | flags) << 4 | 0xb;
  return;
}

Assistant:

SYSBVM_API void sysbvm_function_addFlags(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_bitflags_t flags)
{
    if(!sysbvm_tuple_isFunction(context, function))
        sysbvm_error("Expected a function.");

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    functionObject->flags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(functionObject->flags) | flags);
}